

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O0

void __thiscall GdlNumericExpression::GdlNumericExpression(GdlNumericExpression *this,int nValue)

{
  undefined4 in_ESI;
  long *in_RDI;
  GdlSimpleExpression *in_stack_ffffffffffffffe0;
  
  GdlSimpleExpression::GdlSimpleExpression(in_stack_ffffffffffffffe0);
  *in_RDI = (long)&PTR_Clone_0036aeb0;
  *(undefined4 *)((long)in_RDI + 0x34) = in_ESI;
  *(undefined4 *)(in_RDI + 7) = 0xffffffff;
  *(undefined1 *)((long)in_RDI + 0x3c) = 0;
  (**(code **)(*in_RDI + 0x18))(in_RDI,1);
  return;
}

Assistant:

GdlNumericExpression(int nValue)
		:	GdlSimpleExpression(),
			m_nValue(nValue),
			m_munits(kmunitNone),
			m_fBoolean(false)
	{
		SetType(kexptNumber);
	}